

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow(bool *p_open)

{
  int *current_item;
  ImGuiMetricsConfig *v;
  ImVector<ImGuiWindow_*> *windows;
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiPopupData *pIVar3;
  undefined8 *puVar4;
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImGuiContext *g;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  int rect_n;
  long lVar13;
  ImDrawList *this;
  char *pcVar14;
  long lVar15;
  uint *puVar16;
  float fVar17;
  ImRect IVar18;
  ImVec2 local_90;
  ImRect r;
  char *wrt_rects_names [7];
  
  bVar8 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  pIVar6 = GImGui;
  if (bVar8) {
    Text("Dear ImGui %s","1.80 WIP");
    fVar17 = (pIVar6->IO).Framerate;
    Text("Application average %.3f ms/frame (%.1f FPS)",SUB84((double)(1000.0 / fVar17),0),
         (double)fVar17);
    iVar1 = (pIVar6->IO).MetricsRenderIndices;
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar6->IO).MetricsRenderVertices,
         (long)iVar1,(ulong)(uint)(iVar1 / 3));
    Text("%d active windows (%d visible)",(ulong)(uint)(pIVar6->IO).MetricsActiveWindows,
         (ulong)(uint)(pIVar6->IO).MetricsRenderWindows);
    Text("%d active allocations",(ulong)(uint)(pIVar6->IO).MetricsActiveAllocations);
    Separator();
    wrt_rects_names[6] = "ContentRegionRect";
    wrt_rects_names[4] = "WorkRect";
    wrt_rects_names[5] = "Content";
    wrt_rects_names[2] = "InnerRect";
    wrt_rects_names[3] = "InnerClipRect";
    wrt_rects_names[0] = "OuterRect";
    wrt_rects_names[1] = "OuterRectClipped";
    current_item = &(pIVar6->DebugMetricsConfig).ShowWindowsRectsType;
    if ((pIVar6->DebugMetricsConfig).ShowWindowsRectsType < 0) {
      *current_item = 4;
    }
    if ((pIVar6->DebugMetricsConfig).ShowTablesRectsType < 0) {
      (pIVar6->DebugMetricsConfig).ShowTablesRectsType = 1;
    }
    v = &pIVar6->DebugMetricsConfig;
    bVar8 = TreeNode("Tools");
    if (bVar8) {
      auVar5._8_8_ = 0;
      auVar5._0_4_ = r.Max.x;
      auVar5._4_4_ = r.Max.y;
      r = (ImRect)(auVar5 << 0x40);
      bVar8 = Button("Item Picker..",&r.Min);
      if (bVar8) {
        GImGui->DebugItemPickerActive = true;
      }
      pIVar7 = GImGui;
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->WriteAccessed = true;
      if (pIVar2->SkipItems == false) {
        (pIVar2->DC).CursorPos.x = (pIVar7->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
        (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
        (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
        (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      }
      TextDisabled("(?)");
      bVar8 = IsItemHovered(0);
      if (bVar8) {
        BeginTooltipEx(0,0);
        PushTextWrapPos(GImGui->FontSize * 35.0);
        TextUnformatted("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                        ,(char *)0x0);
        pIVar2 = GImGui->CurrentWindow;
        pIVar2->WriteAccessed = true;
        iVar1 = (pIVar2->DC).TextWrapPosStack.Size;
        iVar10 = iVar1 + -1;
        (pIVar2->DC).TextWrapPosStack.Size = iVar10;
        if (iVar10 == 0) {
          fVar17 = -1.0;
        }
        else {
          fVar17 = (pIVar2->DC).TextWrapPosStack.Data[(long)iVar1 + -2];
        }
        (pIVar2->DC).TextWrapPos = fVar17;
        End();
      }
      Checkbox("Show windows begin order",&(pIVar6->DebugMetricsConfig).ShowWindowsBeginOrder);
      Checkbox("Show windows rectangles",&v->ShowWindowsRects);
      pIVar7 = GImGui;
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->WriteAccessed = true;
      if (pIVar2->SkipItems == false) {
        (pIVar2->DC).CursorPos.x = (pIVar7->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
        (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
        (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
        (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      }
      fVar17 = pIVar7->FontSize;
      *(byte *)&(pIVar7->NextItemData).Flags = (byte)(pIVar7->NextItemData).Flags | 1;
      (pIVar7->NextItemData).Width = fVar17 * 12.0;
      bVar8 = Combo("##show_windows_rect_type",current_item,wrt_rects_names,7,7);
      v->ShowWindowsRects = (bool)(v->ShowWindowsRects | bVar8);
      if ((v->ShowWindowsRects != false) && (pIVar6->NavWindow != (ImGuiWindow *)0x0)) {
        lVar13 = 0;
        BulletText("\'%s\':",pIVar6->NavWindow->Name);
        pIVar7 = GImGui;
        pIVar2 = GImGui->CurrentWindow;
        pIVar2->WriteAccessed = true;
        fVar17 = (pIVar7->Style).IndentSpacing + (pIVar2->DC).Indent.x;
        (pIVar2->DC).Indent.x = fVar17;
        (pIVar2->DC).CursorPos.x = fVar17 + (pIVar2->Pos).x + (pIVar2->DC).ColumnsOffset.x;
        do {
          IVar18 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar6->NavWindow,(int)lVar13);
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar18.Min.x,0),
               (double)IVar18.Min.y,(double)IVar18.Max.x,(double)IVar18.Max.y,
               (double)(IVar18.Max.x - IVar18.Min.x),(double)(IVar18.Max.y - IVar18.Min.y),
               wrt_rects_names[lVar13]);
          pIVar7 = GImGui;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 7);
        pIVar2 = GImGui->CurrentWindow;
        pIVar2->WriteAccessed = true;
        fVar17 = (pIVar2->DC).Indent.x - (pIVar7->Style).IndentSpacing;
        (pIVar2->DC).Indent.x = fVar17;
        (pIVar2->DC).CursorPos.x = fVar17 + (pIVar2->Pos).x + (pIVar2->DC).ColumnsOffset.x;
      }
      Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar6->DebugMetricsConfig).ShowDrawCmdMesh);
      Checkbox("Show ImDrawCmd bounding boxes when hovering",
               &(pIVar6->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
      TreePop();
    }
    windows = &pIVar6->Windows;
    DebugNodeWindowsList(windows,"Windows");
    bVar8 = TreeNode("DrawLists","Active DrawLists (%d)",
                     (ulong)(uint)(pIVar6->DrawDataBuilder).Layers[0].Size);
    if (bVar8) {
      if (0 < (pIVar6->DrawDataBuilder).Layers[0].Size) {
        lVar13 = 0;
        do {
          DebugNodeDrawList((ImGuiWindow *)0x0,(pIVar6->DrawDataBuilder).Layers[0].Data[lVar13],
                            "DrawList");
          lVar13 = lVar13 + 1;
        } while (lVar13 < (pIVar6->DrawDataBuilder).Layers[0].Size);
      }
      TreePop();
    }
    bVar8 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar6->OpenPopupStack).Size);
    if (bVar8) {
      if (0 < (pIVar6->OpenPopupStack).Size) {
        lVar15 = 8;
        lVar13 = 0;
        do {
          pIVar3 = (pIVar6->OpenPopupStack).Data;
          puVar4 = *(undefined8 **)((long)&pIVar3->PopupId + lVar15);
          pcVar11 = "NULL";
          if (puVar4 != (undefined8 *)0x0) {
            pcVar11 = (char *)*puVar4;
          }
          pcVar9 = "";
          if ((puVar4 != (undefined8 *)0x0) &&
             (pcVar9 = " ChildWindow", (*(byte *)((long)puVar4 + 0xf) & 1) == 0)) {
            pcVar9 = "";
          }
          pcVar14 = "";
          if ((puVar4 != (undefined8 *)0x0) &&
             (pcVar14 = " ChildMenu", (*(byte *)((long)puVar4 + 0xf) & 0x10) == 0)) {
            pcVar14 = "";
          }
          BulletText("PopupID: %08x, Window: \'%s\'%s%s",
                     (ulong)*(uint *)((long)pIVar3 + lVar15 + -8),pcVar11,pcVar9,pcVar14);
          lVar13 = lVar13 + 1;
          lVar15 = lVar15 + 0x30;
        } while (lVar13 < (pIVar6->OpenPopupStack).Size);
      }
      TreePop();
    }
    bVar8 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar6->TabBars).Buf.Size);
    if (bVar8) {
      if (0 < (pIVar6->TabBars).Buf.Size) {
        lVar13 = 0;
        lVar15 = 0;
        do {
          DebugNodeTabBar((ImGuiTabBar *)((long)&(((pIVar6->TabBars).Buf.Data)->Tabs).Size + lVar13)
                          ,"TabBar");
          lVar15 = lVar15 + 1;
          lVar13 = lVar13 + 0x98;
        } while (lVar15 < (pIVar6->TabBars).Buf.Size);
      }
      TreePop();
    }
    bVar8 = TreeNode("Settings");
    if (bVar8) {
      bVar8 = SmallButton("Clear");
      if (bVar8) {
        ClearIniSettings();
      }
      pIVar7 = GImGui;
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->WriteAccessed = true;
      if (pIVar2->SkipItems == false) {
        (pIVar2->DC).CursorPos.x = (pIVar7->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
        (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
        (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
        (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      }
      bVar8 = SmallButton("Save to memory");
      if (bVar8) {
        SaveIniSettingsToMemory((size_t *)0x0);
      }
      pIVar7 = GImGui;
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->WriteAccessed = true;
      if (pIVar2->SkipItems == false) {
        (pIVar2->DC).CursorPos.x = (pIVar7->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
        (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
        (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
        (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      }
      bVar8 = SmallButton("Save to disk");
      if (bVar8) {
        SaveIniSettingsToDisk((pIVar6->IO).IniFilename);
      }
      pIVar7 = GImGui;
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->WriteAccessed = true;
      if (pIVar2->SkipItems == false) {
        (pIVar2->DC).CursorPos.x = (pIVar7->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
        (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
        (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
        (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      }
      if ((pIVar6->IO).IniFilename == (char *)0x0) {
        TextUnformatted("<NULL>",(char *)0x0);
      }
      else {
        Text("\"%s\"");
      }
      Text("SettingsDirtyTimer %.2f",SUB84((double)pIVar6->SettingsDirtyTimer,0));
      bVar8 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                       (ulong)(uint)(pIVar6->SettingsHandlers).Size);
      if (bVar8) {
        if (0 < (pIVar6->SettingsHandlers).Size) {
          lVar13 = 0;
          lVar15 = 0;
          do {
            BulletText("%s",*(undefined8 *)
                             ((long)&((pIVar6->SettingsHandlers).Data)->TypeName + lVar13));
            lVar15 = lVar15 + 1;
            lVar13 = lVar13 + 0x48;
          } while (lVar15 < (pIVar6->SettingsHandlers).Size);
        }
        TreePop();
      }
      bVar8 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                       (ulong)(uint)(pIVar6->SettingsWindows).Buf.Size);
      if (bVar8) {
        pcVar11 = (pIVar6->SettingsWindows).Buf.Data;
        if (pcVar11 != (char *)0x0) {
          puVar16 = (uint *)(pcVar11 + 4);
          do {
            Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",(ulong)*puVar16,puVar16 + 4,
                 (ulong)(uint)(int)(short)puVar16[1],(ulong)(uint)(int)*(short *)((long)puVar16 + 6)
                 ,(ulong)(uint)(int)(short)puVar16[2],
                 (ulong)(uint)(int)*(short *)((long)puVar16 + 10),(ulong)(byte)puVar16[3]);
            puVar16 = (uint *)((long)(int)puVar16[-1] + (long)puVar16);
          } while (puVar16 !=
                   (uint *)((pIVar6->SettingsWindows).Buf.Data +
                           (long)(pIVar6->SettingsWindows).Buf.Size + 4));
        }
        TreePop();
      }
      iVar1 = (pIVar6->SettingsIniData).Buf.Size;
      uVar12 = (ulong)(iVar1 - 1);
      if (iVar1 == 0) {
        uVar12 = 0;
      }
      bVar8 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar12);
      if (bVar8) {
        pcVar11 = (pIVar6->SettingsIniData).Buf.Data;
        if (pcVar11 == (char *)0x0) {
          pcVar11 = ImGuiTextBuffer::EmptyString;
        }
        r.Min.y = GImGui->FontSize * 20.0;
        r.Min.x = -1.1754944e-38;
        InputTextMultiline("##Ini",pcVar11,(long)(pIVar6->SettingsIniData).Buf.Size,&r.Min,0x4000,
                           (ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      TreePop();
    }
    bVar8 = TreeNode("Internal state");
    if (bVar8) {
      Text("WINDOWING");
      pIVar7 = GImGui;
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->WriteAccessed = true;
      fVar17 = (pIVar7->Style).IndentSpacing + (pIVar2->DC).Indent.x;
      (pIVar2->DC).Indent.x = fVar17;
      (pIVar2->DC).CursorPos.x = fVar17 + (pIVar2->Pos).x + (pIVar2->DC).ColumnsOffset.x;
      pcVar9 = "NULL";
      pcVar11 = "NULL";
      if (pIVar6->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar6->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar11);
      pcVar11 = "NULL";
      if (pIVar6->HoveredRootWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar6->HoveredRootWindow->Name;
      }
      Text("HoveredRootWindow: \'%s\'",pcVar11);
      pcVar11 = "NULL";
      if (pIVar6->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar6->HoveredWindowUnderMovingWindow->Name;
      }
      Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar11);
      pcVar11 = "NULL";
      if (pIVar6->MovingWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar6->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",pcVar11);
      pIVar7 = GImGui;
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->WriteAccessed = true;
      fVar17 = (pIVar2->DC).Indent.x - (pIVar7->Style).IndentSpacing;
      (pIVar2->DC).Indent.x = fVar17;
      (pIVar2->DC).CursorPos.x = fVar17 + (pIVar2->Pos).x + (pIVar2->DC).ColumnsOffset.x;
      Text("ITEMS");
      pIVar7 = GImGui;
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->WriteAccessed = true;
      fVar17 = (pIVar7->Style).IndentSpacing + (pIVar2->DC).Indent.x;
      (pIVar2->DC).Indent.x = fVar17;
      (pIVar2->DC).CursorPos.x = fVar17 + (pIVar2->Pos).x + (pIVar2->DC).ColumnsOffset.x;
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           SUB84((double)pIVar6->ActiveIdTimer,0),(ulong)pIVar6->ActiveId,
           (ulong)pIVar6->ActiveIdPreviousFrame,(ulong)pIVar6->ActiveIdAllowOverlap,
           *(undefined8 *)(&DAT_0018f820 + (ulong)pIVar6->ActiveIdSource * 8));
      pcVar11 = "NULL";
      if (pIVar6->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar6->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar11);
      Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",
           SUB84((double)pIVar6->HoveredIdTimer,0),(ulong)pIVar6->HoveredId,
           (ulong)pIVar6->HoveredIdPreviousFrame,(ulong)pIVar6->HoveredIdAllowOverlap);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)pIVar6->DragDropActive,(ulong)(pIVar6->DragDropPayload).SourceId,
           (pIVar6->DragDropPayload).DataType,(ulong)(uint)(pIVar6->DragDropPayload).DataSize);
      pIVar7 = GImGui;
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->WriteAccessed = true;
      fVar17 = (pIVar2->DC).Indent.x - (pIVar7->Style).IndentSpacing;
      (pIVar2->DC).Indent.x = fVar17;
      (pIVar2->DC).CursorPos.x = fVar17 + (pIVar2->Pos).x + (pIVar2->DC).ColumnsOffset.x;
      Text("NAV,FOCUS");
      pIVar7 = GImGui;
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->WriteAccessed = true;
      fVar17 = (pIVar7->Style).IndentSpacing + (pIVar2->DC).Indent.x;
      (pIVar2->DC).Indent.x = fVar17;
      (pIVar2->DC).CursorPos.x = fVar17 + (pIVar2->Pos).x + (pIVar2->DC).ColumnsOffset.x;
      pcVar11 = "NULL";
      if (pIVar6->NavWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar6->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar11);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar6->NavId,(ulong)pIVar6->NavLayer);
      Text("NavInputSource: %s",*(undefined8 *)(&DAT_0018f820 + (ulong)pIVar6->NavInputSource * 8));
      Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar6->IO).NavActive,
           (ulong)(pIVar6->IO).NavVisible);
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar6->NavActivateId,
           (ulong)pIVar6->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar6->NavDisableHighlight,
           (ulong)pIVar6->NavDisableMouseHover);
      Text("NavFocusScopeId = 0x%08X",(ulong)pIVar6->NavFocusScopeId);
      if (pIVar6->NavWindowingTarget != (ImGuiWindow *)0x0) {
        pcVar9 = pIVar6->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",pcVar9);
      pIVar7 = GImGui;
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->WriteAccessed = true;
      fVar17 = (pIVar2->DC).Indent.x - (pIVar7->Style).IndentSpacing;
      (pIVar2->DC).Indent.x = fVar17;
      (pIVar2->DC).CursorPos.x = fVar17 + (pIVar2->Pos).x + (pIVar2->DC).ColumnsOffset.x;
      TreePop();
    }
    if (((v->ShowWindowsRects != false) ||
        ((pIVar6->DebugMetricsConfig).ShowWindowsBeginOrder == true)) && (0 < windows->Size)) {
      lVar13 = 0;
      do {
        pIVar2 = (pIVar6->Windows).Data[lVar13];
        if (pIVar2->WasActive == true) {
          this = &GImGui->ForegroundDrawList;
          if (v->ShowWindowsRects == true) {
            r = ShowMetricsWindow::Funcs::GetWindowRect(pIVar2,*current_item);
            ImDrawList::AddRect(this,&r.Min,&r.Max,0xff8000ff,0.0,0xf,1.0);
          }
          if (((pIVar6->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
             ((pIVar2->Flags & 0x1000000) == 0)) {
            ImFormatString((char *)&r,0x20,"%d",(ulong)(uint)(int)pIVar2->BeginOrderWithinContext);
            local_90.y = GImGui->FontSize + (pIVar2->Pos).y;
            local_90.x = GImGui->FontSize + (pIVar2->Pos).x;
            ImDrawList::AddRectFilled(this,&pIVar2->Pos,&local_90,0xff6464c8,0.0,0xf);
            ImDrawList::AddText(this,&pIVar2->Pos,0xffffffff,(char *)&r,(char *)0x0);
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < windows->Size);
    }
    End();
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Metrics/Debugger", p_open))
    {
        End();
        return;
    }

    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;

    // Basic info
    Text("Dear ImGui %s", ImGui::GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    Text("%d active allocations", io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentRowsFrozen, TRT_ColumnsContentRowsUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentRowsFrozen", "ColumnsContentRowsUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)              { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);
        TreePop();
    }

    // Contents
    DebugNodeWindowsList(&g.Windows, "Windows");
    //DebugNodeWindowList(&g.WindowsFocusOrder, "WindowsFocusOrder");
    if (TreeNode("DrawLists", "Active DrawLists (%d)", g.DrawDataBuilder.Layers[0].Size))
    {
        for (int i = 0; i < g.DrawDataBuilder.Layers[0].Size; i++)
            DebugNodeDrawList(NULL, g.DrawDataBuilder.Layers[0][i], "DrawList");
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetSize()))
    {
        for (int n = 0; n < g.TabBars.GetSize(); n++)
            DebugNodeTabBar(g.TabBars.GetByIndex(n), "TabBar");
        TreePop();
    }

    // Details for Tables
    IM_UNUSED(trt_rects_names);
#ifdef IMGUI_HAS_TABLE
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetSize()))
    {
        for (int n = 0; n < g.Tables.GetSize(); n++)
            DebugNodeTable(g.Tables.GetByIndex(n));
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_TABLE

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_TABLE
        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

#ifdef IMGUI_HAS_TABLE
    // Overlay: Display Tables Rectangles
    if (show_tables_rects)
    {
        for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.GetByIndex(table_n);
        }
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}